

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.cpp
# Opt level: O1

GrobIndex __thiscall lume::TotalToGrobIndexMap::operator()(TotalToGrobIndexMap *this,index_t ind)

{
  uint *puVar1;
  pointer pgVar2;
  pointer puVar3;
  LumeError *this_00;
  string *what;
  GrobIndex GVar4;
  long lVar5;
  long lVar6;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pgVar2 = (this->m_grobTypes).super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_grobTypes).super__Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pgVar2;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 2;
    puVar3 = (this->m_baseInds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      if ((*puVar1 <= ind) && (ind < puVar3[lVar6 + 1])) {
        GVar4.index = ind - *puVar1;
        GVar4.grobType = pgVar2[lVar6];
        return GVar4;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  this_00 = (LumeError *)__cxa_allocate_exception(0x30);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"TotalToGrobIndexMap: Couldn\'t map index ","");
  std::__cxx11::to_string(&local_60,ind);
  what = (string *)
         std::__cxx11::string::_M_append((char *)local_40,(ulong)local_60._M_dataplus._M_p);
  LumeError::LumeError(this_00,what);
  __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
}

Assistant:

GrobIndex TotalToGrobIndexMap::
operator () (const index_t ind) const
{
	const size_t numGrobTypes = m_grobTypes.size();
    for(size_t i = 0; i < numGrobTypes; ++i) {
      	if (ind >= m_baseInds [i] && ind < m_baseInds [i+1])
        	return GrobIndex(m_grobTypes[i], ind - m_baseInds[i]);
    }

    throw LumeError (string("TotalToGrobIndexMap: Couldn't map index ").
    					append (to_string(ind)));
    return GrobIndex (NO_GROB, 0);
}